

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData *
cfd::core::CalculateRangeProof
          (ByteData *__return_storage_ptr__,uint64_t value,Pubkey *pubkey,Privkey *privkey,
          ConfidentialAssetId *asset,vector<unsigned_char,_std::allocator<unsigned_char>_> *abf,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbf,Script *script,
          int64_t minimum_range_value,int exponent,int minimum_bits,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *commitment,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *range_proof)

{
  bool bVar1;
  size_type sVar2;
  const_reference this;
  uchar *puVar3;
  size_type sVar4;
  uchar *puVar5;
  size_type sVar6;
  size_type local_588;
  uchar *local_580;
  size_type local_578;
  uchar *local_570;
  size_type local_568;
  uchar *local_560;
  size_type local_558;
  uchar *local_550;
  size_type local_548;
  uchar *local_540;
  size_type local_538;
  uchar *local_530;
  uchar *local_528;
  size_type local_520;
  vector<unsigned_char,_std::allocator<unsigned_char>_> **local_518;
  size_type local_510;
  vector<unsigned_char,_std::allocator<unsigned_char>_> **local_508;
  CfdException *local_4f8;
  allocator *local_4f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4e8;
  uchar *local_4e0;
  size_type local_4d8;
  uint64_t local_4d0;
  uchar *local_4c8;
  size_type local_4c0;
  size_type local_4b8;
  uchar *local_4b0;
  undefined1 *local_4a8;
  size_type local_4a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> **local_498;
  int local_490;
  int local_48c;
  uchar *local_488;
  size_type local_480;
  uchar *local_478;
  size_type local_470;
  uchar *local_468;
  uchar *local_460;
  int local_454;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_450;
  uchar *local_448;
  size_type local_440;
  uint64_t local_438;
  uchar *local_430;
  size_type local_428;
  size_type local_420;
  uchar *local_418;
  undefined1 *local_410;
  size_type local_408;
  uchar *local_400;
  int local_3f8;
  int local_3f4;
  uchar *local_3f0;
  size_type local_3e8;
  uchar *local_3e0;
  uchar *local_3d8;
  int local_3cc;
  CfdException *local_3c8;
  allocator *local_3c0;
  CfdException *local_3b8;
  allocator *local_3b0;
  undefined1 local_3a1;
  ScriptOperator *local_3a0;
  CfdException *local_398;
  allocator *local_390;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_388;
  uint64_t local_380;
  uchar *local_378;
  size_type local_370;
  uchar *local_368;
  size_type local_360;
  uchar *local_358;
  int local_34c;
  CfdException *local_348;
  allocator *local_340;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_338;
  uchar *local_330;
  size_type local_328;
  uchar *local_320;
  size_type local_318;
  uchar *local_310;
  int local_304;
  ByteData *local_300;
  ByteData *local_2f8;
  allocator_type *local_2f0;
  undefined1 local_2e2;
  allocator local_2e1;
  string local_2e0;
  CfdSourceLocation local_2c0;
  ByteData local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_278;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pubkey_byte;
  string local_268;
  CfdSourceLocation local_248;
  undefined1 local_22a;
  allocator local_229;
  string local_228;
  CfdSourceLocation local_208;
  uchar *local_1f0;
  int64_t min_range_value;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *local_1d0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *script_item;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *privkey_byte;
  size_t size;
  string local_148;
  CfdSourceLocation local_128;
  undefined1 local_10a;
  allocator local_109;
  string local_108;
  CfdSourceLocation local_e8;
  int local_cc;
  undefined1 local_c8 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *asset_bytes;
  allocator<unsigned_char> local_79;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *abf_local;
  ConfidentialAssetId *asset_local;
  Privkey *privkey_local;
  Pubkey *pubkey_local;
  uint64_t value_local;
  
  local_2f0 = &local_79;
  local_300 = __return_storage_ptr__;
  local_2f8 = __return_storage_ptr__;
  generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)abf;
  ::std::allocator<unsigned_char>::allocator(local_2f0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,0x21,local_2f0);
  ::std::allocator<unsigned_char>::~allocator(&local_79);
  ConfidentialAssetId::GetUnblindedData((ByteData *)local_c8,asset);
  ByteData::GetBytes(&local_b0,(ByteData *)local_c8);
  ByteData::~ByteData((ByteData *)local_c8);
  local_98 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0;
  local_330 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_98);
  local_328 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_98);
  local_320 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_318 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_338 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78;
  local_310 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_338);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_338);
  local_304 = wally_asset_generator_from_bytes
                        (local_330,local_328,local_320,local_318,local_310,sVar2);
  local_cc = local_304;
  if (local_304 != 0) {
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x7f;
    local_e8.funcname = "CalculateRangeProof";
    logger::warn<int&>(&local_e8,"wally_asset_generator_from_bytes NG[{}].",&local_cc);
    local_10a = 1;
    local_348 = (CfdException *)__cxa_allocate_exception(0x30);
    local_340 = &local_109;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_108,"output asset generator error.",local_340);
    CfdException::CfdException(local_348,kCfdIllegalStateError,&local_108);
    local_10a = 0;
    __cxa_throw(local_348,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment,0x21);
  local_380 = value;
  local_378 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
  local_370 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
  local_388 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78;
  local_368 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_388);
  local_360 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_388);
  local_358 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
  local_588 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
  local_34c = wally_asset_value_commitment
                        (local_380,local_378,local_370,local_368,local_360,local_358);
  local_cc = local_34c;
  if (local_34c != 0) {
    local_128.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_128.filename = local_128.filename + 1;
    local_128.line = 0x88;
    local_128.funcname = "CalculateRangeProof";
    logger::warn<int&>(&local_128,"wally_asset_value_commitment NG[{}].",&local_cc);
    size._6_1_ = 1;
    local_398 = (CfdException *)__cxa_allocate_exception(0x30);
    local_390 = (allocator *)((long)&size + 7);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_148,"calc asset commitment error.",local_390);
    CfdException::CfdException(local_398,kCfdIllegalStateError,&local_148);
    size._6_1_ = 0;
    __cxa_throw(local_398,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof,0x140e);
  privkey_byte = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  Privkey::GetData((ByteData *)&script_byte,privkey);
  ByteData::GetBytes(&local_178,(ByteData *)&script_byte);
  ByteData::~ByteData((ByteData *)&script_byte);
  local_160 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178;
  Script::GetData((ByteData *)&script_item,script);
  ByteData::GetBytes(&local_1b0,(ByteData *)&script_item);
  ByteData::~ByteData((ByteData *)&script_item);
  local_198 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0;
  Script::GetElementList
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             &min_range_value,script);
  local_1d0 = (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
              &min_range_value;
  local_1f0 = (uchar *)minimum_range_value;
  bVar1 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::empty
                    (local_1d0);
  if (!bVar1) {
    this = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
           operator[](local_1d0,0);
    local_3a0 = ScriptElement::GetOpCode(this);
    local_3a1 = ScriptOperator::operator==(local_3a0,(ScriptOperator *)ScriptOperator::OP_RETURN);
    if ((!(bool)local_3a1) &&
       (sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_198),
       sVar2 < 0x2711)) {
      if (value == 0) {
        local_208.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_208.filename = local_208.filename + 1;
        local_208.line = 0x9b;
        local_208.funcname = "CalculateRangeProof";
        logger::warn<>(&local_208,
                       "Amount is 0. Cannot specify 0 for amount if there is a valid confidential address."
                      );
        local_22a = 1;
        local_3b8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_3b0 = &local_229;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_228,
                   "Amount is 0. Cannot specify 0 for amount if there is a valid confidential address."
                   ,local_3b0);
        CfdException::CfdException(local_3b8,kCfdIllegalArgumentError,&local_228);
        local_22a = 0;
        __cxa_throw(local_3b8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      goto LAB_0032d0b1;
    }
  }
  local_1f0 = (uchar *)0x0;
LAB_0032d0b1:
  if (value < local_1f0) {
    local_248.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_248.filename = local_248.filename + 1;
    local_248.line = 0xa5;
    local_248.funcname = "CalculateRangeProof";
    logger::warn<>(&local_248,"amount less than minimumRangeValue");
    pubkey_byte._6_1_ = 1;
    local_3c8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_3c0 = (allocator *)((long)&pubkey_byte + 7);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_268,"The amount is less than the minimumRangeValue.",local_3c0);
    CfdException::CfdException(local_3c8,kCfdIllegalArgumentError,&local_268);
    pubkey_byte._6_1_ = 0;
    __cxa_throw(local_3c8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (pubkey == (Pubkey *)0x0) {
    local_438 = value;
    local_430 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_160);
    local_428 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_160);
    local_3d8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_98);
    local_420 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_98);
    local_418 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           generator.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    local_440 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           generator.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    local_448 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
    sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
    puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_198);
    sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_198);
    local_450 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78;
    local_3e0 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_450);
    local_3e8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_450);
    local_3f0 = local_1f0;
    local_3f4 = exponent;
    local_3f8 = minimum_bits;
    local_400 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof);
    local_520 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof);
    local_518 = &privkey_byte;
    local_528 = local_400;
    local_530 = (uchar *)CONCAT44(local_530._4_4_,local_3f8);
    local_538 = CONCAT44(local_538._4_4_,local_3f4);
    local_540 = local_3f0;
    local_548 = local_3e8;
    local_550 = local_3e0;
    local_580 = local_448;
    local_588 = local_440;
    local_578 = sVar2;
    local_570 = puVar3;
    local_568 = sVar4;
    local_560 = puVar5;
    local_558 = sVar6;
    local_410 = (undefined1 *)&local_588;
    local_408 = local_520;
    local_3cc = wally_asset_rangeproof_with_nonce
                          (local_438,local_430,local_428,local_3d8,local_420,local_418);
    local_cc = local_3cc;
  }
  else {
    Pubkey::GetData(&local_2a8,pubkey);
    ByteData::GetBytes(&local_290,&local_2a8);
    ByteData::~ByteData(&local_2a8);
    local_278 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290;
    local_4d0 = value;
    local_4c8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_278);
    local_4c0 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_278);
    local_460 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_160);
    local_4b8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_160);
    local_4b0 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_98);
    local_4d8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_98);
    local_4e0 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           generator.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
    puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
    sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
    local_468 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_198);
    local_470 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_198);
    local_4e8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78;
    local_478 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_4e8);
    local_480 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_4e8);
    local_488 = local_1f0;
    local_48c = exponent;
    local_490 = minimum_bits;
    local_498 = (vector<unsigned_char,_std::allocator<unsigned_char>_> **)
                ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof);
    local_510 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof);
    local_508 = &privkey_byte;
    local_518 = local_498;
    local_520 = CONCAT44(local_520._4_4_,local_490);
    local_528 = (uchar *)CONCAT44(local_528._4_4_,local_48c);
    local_530 = local_488;
    local_538 = local_480;
    local_540 = local_478;
    local_548 = local_470;
    local_550 = local_468;
    local_580 = local_4e0;
    local_588 = local_4d8;
    local_578 = sVar2;
    local_570 = puVar3;
    local_568 = sVar4;
    local_560 = puVar5;
    local_558 = sVar6;
    local_4a8 = (undefined1 *)&local_588;
    local_4a0 = local_510;
    local_454 = wally_asset_rangeproof(local_4d0,local_4c8,local_4c0,local_460,local_4b8,local_4b0);
    local_cc = local_454;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290);
  }
  if (local_cc == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof,
               (size_type)privkey_byte);
    ByteData::ByteData(local_300,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &min_range_value);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    return local_2f8;
  }
  local_2c0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_2c0.filename = local_2c0.filename + 1;
  local_2c0.line = 0xbf;
  local_2c0.funcname = "CalculateRangeProof";
  logger::warn<int&>(&local_2c0,"wally_asset_rangeproof NG[{}].",&local_cc);
  local_2e2 = 1;
  local_4f8 = (CfdException *)__cxa_allocate_exception(0x30);
  local_4f0 = &local_2e1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2e0,"calc asset rangeproof error.",local_4f0);
  CfdException::CfdException(local_4f8,kCfdIllegalStateError,&local_2e0);
  local_2e2 = 0;
  __cxa_throw(local_4f8,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static ByteData CalculateRangeProof(
    const uint64_t value, const Pubkey *pubkey, const Privkey &privkey,
    const ConfidentialAssetId &asset, const std::vector<uint8_t> &abf,
    const std::vector<uint8_t> &vbf, const Script &script,
    int64_t minimum_range_value, int exponent, int minimum_bits,
    std::vector<uint8_t> *commitment, std::vector<uint8_t> *range_proof) {
  std::vector<uint8_t> generator(ASSET_GENERATOR_LEN);
  const std::vector<uint8_t> &asset_bytes =
      asset.GetUnblindedData().GetBytes();
  int ret = wally_asset_generator_from_bytes(
      asset_bytes.data(), asset_bytes.size(), abf.data(), abf.size(),
      generator.data(), generator.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_generator_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "output asset generator error.");
  }

  commitment->resize(ASSET_COMMITMENT_LEN);
  ret = wally_asset_value_commitment(
      value, vbf.data(), vbf.size(), generator.data(), generator.size(),
      commitment->data(), commitment->size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_value_commitment NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "calc asset commitment error.");
  }
  // info(
  //    CFD_LOG_SOURCE, "generator=[{}] commitment=[{}]",
  //    ByteData(generator).GetHex(), ByteData(commitment).GetHex());

  range_proof->resize(ASSET_RANGEPROOF_MAX_LEN);
  size_t size = 0;
  const std::vector<uint8_t> &privkey_byte = privkey.GetData().GetBytes();
  const std::vector<uint8_t> &script_byte = script.GetData().GetBytes();
  const std::vector<ScriptElement> &script_item = script.GetElementList();
  int64_t min_range_value = minimum_range_value;
  if (script_item.empty() ||
      (script_item[0].GetOpCode() == ScriptOperator::OP_RETURN) ||
      (script_byte.size() > Script::kMaxScriptSize)) {
    min_range_value = 0;
  } else if (value == 0) {
    warn(
        CFD_LOG_SOURCE,
        "Amount is 0. Cannot specify 0 for amount "
        "if there is a valid confidential address.");  // NOLINT
    throw CfdException(
        kCfdIllegalArgumentError,
        "Amount is 0. Cannot specify 0 for amount "
        "if there is a valid confidential address.");  // NOLINT
  }

  if (value < static_cast<uint64_t>(min_range_value)) {
    warn(CFD_LOG_SOURCE, "amount less than minimumRangeValue");
    throw CfdException(
        kCfdIllegalArgumentError,
        "The amount is less than the minimumRangeValue.");
  }

  if (pubkey == nullptr) {
    ret = wally_asset_rangeproof_with_nonce(
        value, privkey_byte.data(), privkey_byte.size(), asset_bytes.data(),
        asset_bytes.size(), abf.data(), abf.size(), vbf.data(), vbf.size(),
        commitment->data(), commitment->size(), script_byte.data(),
        script_byte.size(), generator.data(), generator.size(),
        static_cast<uint64_t>(min_range_value), exponent, minimum_bits,
        range_proof->data(), range_proof->size(), &size);
  } else {
    const std::vector<uint8_t> &pubkey_byte = pubkey->GetData().GetBytes();
    ret = wally_asset_rangeproof(
        value, pubkey_byte.data(), pubkey_byte.size(), privkey_byte.data(),
        privkey_byte.size(), asset_bytes.data(), asset_bytes.size(),
        abf.data(), abf.size(), vbf.data(), vbf.size(), commitment->data(),
        commitment->size(), script_byte.data(), script_byte.size(),
        generator.data(), generator.size(),
        static_cast<uint64_t>(min_range_value), exponent, minimum_bits,
        range_proof->data(), range_proof->size(), &size);
  }
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_rangeproof NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "calc asset rangeproof error.");
  }
  range_proof->resize(size);
  return ByteData(generator);
}